

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::ReduceMaxLayerParams::SharedCtor(ReduceMaxLayerParams *this)

{
  this->keepdims_ = false;
  this->reduceall_ = false;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void ReduceMaxLayerParams::SharedCtor() {
  ::memset(&keepdims_, 0, reinterpret_cast<char*>(&reduceall_) -
    reinterpret_cast<char*>(&keepdims_) + sizeof(reduceall_));
  _cached_size_ = 0;
}